

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.cc
# Opt level: O3

CRYPTO_BUFFER *
crypto_buffer_new(uint8_t *data,size_t len,int data_is_static,CRYPTO_BUFFER_POOL *pool)

{
  CRYPTO_MUTEX *pCVar1;
  int iVar2;
  CRYPTO_BUFFER *pCVar3;
  uint8_t *puVar4;
  CRYPTO_BUFFER *pCVar5;
  CRYPTO_BUFFER tmp;
  CRYPTO_BUFFER_POOL *local_50;
  uint8_t *local_48;
  size_t local_40;
  
  if (pool != (CRYPTO_BUFFER_POOL *)0x0) {
    pCVar1 = &pool->lock;
    local_50 = pool;
    local_48 = data;
    local_40 = len;
    CRYPTO_MUTEX_lock_read(pCVar1);
    pCVar3 = (CRYPTO_BUFFER *)
             OPENSSL_lh_retrieve((_LHASH *)pool->bufs,&local_50,lh_CRYPTO_BUFFER_call_hash_func,
                                 lh_CRYPTO_BUFFER_call_cmp_func);
    if (pCVar3 == (CRYPTO_BUFFER *)0x0 || data_is_static == 0) {
      if (pCVar3 != (CRYPTO_BUFFER *)0x0) goto LAB_0019888a;
    }
    else if (pCVar3->data_is_static != 0) {
LAB_0019888a:
      CRYPTO_refcount_inc(&pCVar3->references);
      CRYPTO_MUTEX_unlock_read(pCVar1);
      return pCVar3;
    }
    CRYPTO_MUTEX_unlock_read(pCVar1);
  }
  pCVar3 = (CRYPTO_BUFFER *)OPENSSL_zalloc(0x20);
  if (pCVar3 == (CRYPTO_BUFFER *)0x0) {
    return (CRYPTO_BUFFER *)0x0;
  }
  if (data_is_static == 0) {
    puVar4 = (uint8_t *)OPENSSL_memdup(data,len);
    pCVar3->data = puVar4;
    if (puVar4 == (uint8_t *)0x0 && len != 0) {
      OPENSSL_free(pCVar3);
      return (CRYPTO_BUFFER *)0x0;
    }
  }
  else {
    pCVar3->data = data;
    pCVar3->data_is_static = 1;
  }
  pCVar3->len = len;
  pCVar3->references = 1;
  if (pool == (CRYPTO_BUFFER_POOL *)0x0) {
    return pCVar3;
  }
  pCVar3->pool = pool;
  pCVar1 = &pool->lock;
  CRYPTO_MUTEX_lock_write(pCVar1);
  pCVar5 = (CRYPTO_BUFFER *)
           OPENSSL_lh_retrieve((_LHASH *)pool->bufs,pCVar3,lh_CRYPTO_BUFFER_call_hash_func,
                               lh_CRYPTO_BUFFER_call_cmp_func);
  if (pCVar5 == (CRYPTO_BUFFER *)0x0 || data_is_static == 0) {
    if (pCVar5 != (CRYPTO_BUFFER *)0x0) goto LAB_0019895d;
  }
  else if (pCVar5->data_is_static != 0) {
LAB_0019895d:
    CRYPTO_refcount_inc(&pCVar5->references);
    CRYPTO_MUTEX_unlock_write(pCVar1);
    goto LAB_00198971;
  }
  local_50 = (CRYPTO_BUFFER_POOL *)0x0;
  iVar2 = OPENSSL_lh_insert((_LHASH *)pool->bufs,&local_50,pCVar3,lh_CRYPTO_BUFFER_call_hash_func,
                            lh_CRYPTO_BUFFER_call_cmp_func);
  CRYPTO_MUTEX_unlock_write(pCVar1);
  if (iVar2 != 0) {
    return pCVar3;
  }
  pCVar5 = (CRYPTO_BUFFER *)0x0;
LAB_00198971:
  crypto_buffer_free_object(pCVar3);
  return pCVar5;
}

Assistant:

static CRYPTO_BUFFER *crypto_buffer_new(const uint8_t *data, size_t len,
                                        int data_is_static,
                                        CRYPTO_BUFFER_POOL *pool) {
  if (pool != NULL) {
    CRYPTO_BUFFER tmp;
    tmp.data = (uint8_t *)data;
    tmp.len = len;
    tmp.pool = pool;

    CRYPTO_MUTEX_lock_read(&pool->lock);
    CRYPTO_BUFFER *duplicate = lh_CRYPTO_BUFFER_retrieve(pool->bufs, &tmp);
    if (data_is_static && duplicate != NULL && !duplicate->data_is_static) {
      // If the new |CRYPTO_BUFFER| would have static data, but the duplicate
      // does not, we replace the old one with the new static version.
      duplicate = NULL;
    }
    if (duplicate != NULL) {
      CRYPTO_refcount_inc(&duplicate->references);
    }
    CRYPTO_MUTEX_unlock_read(&pool->lock);

    if (duplicate != NULL) {
      return duplicate;
    }
  }

  CRYPTO_BUFFER *const buf =
      reinterpret_cast<CRYPTO_BUFFER *>(OPENSSL_zalloc(sizeof(CRYPTO_BUFFER)));
  if (buf == NULL) {
    return NULL;
  }

  if (data_is_static) {
    buf->data = (uint8_t *)data;
    buf->data_is_static = 1;
  } else {
    buf->data = reinterpret_cast<uint8_t *>(OPENSSL_memdup(data, len));
    if (len != 0 && buf->data == NULL) {
      OPENSSL_free(buf);
      return NULL;
    }
  }

  buf->len = len;
  buf->references = 1;

  if (pool == NULL) {
    return buf;
  }

  buf->pool = pool;

  CRYPTO_MUTEX_lock_write(&pool->lock);
  CRYPTO_BUFFER *duplicate = lh_CRYPTO_BUFFER_retrieve(pool->bufs, buf);
  if (data_is_static && duplicate != NULL && !duplicate->data_is_static) {
    // If the new |CRYPTO_BUFFER| would have static data, but the duplicate does
    // not, we replace the old one with the new static version.
    duplicate = NULL;
  }
  int inserted = 0;
  if (duplicate == NULL) {
    CRYPTO_BUFFER *old = NULL;
    inserted = lh_CRYPTO_BUFFER_insert(pool->bufs, &old, buf);
    // |old| may be non-NULL if a match was found but ignored. |pool->bufs| does
    // not increment refcounts, so there is no need to clean up after the
    // replacement.
  } else {
    CRYPTO_refcount_inc(&duplicate->references);
  }
  CRYPTO_MUTEX_unlock_write(&pool->lock);

  if (!inserted) {
    // We raced to insert |buf| into the pool and lost, or else there was an
    // error inserting.
    crypto_buffer_free_object(buf);
    return duplicate;
  }

  return buf;
}